

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O2

SynModule * ParseModule(ParseContext *ctx)

{
  Lexeme *begin;
  uint uVar1;
  int iVar2;
  SynBase *node;
  undefined4 extraout_var;
  Lexeme *end;
  undefined4 extraout_var_00;
  IntrusiveList<SynModuleImport> IVar3;
  SynBase *local_68;
  SynBase *pSStack_60;
  IntrusiveList<SynBase> expressions;
  TraceScope traceScope;
  SynModule *this;
  
  if ((ParseModule(ParseContext&)::token == '\0') &&
     (iVar2 = __cxa_guard_acquire(&ParseModule(ParseContext&)::token), iVar2 != 0)) {
    ParseModule::token = NULLC::TraceGetToken("parser","ParseModule");
    __cxa_guard_release(&ParseModule(ParseContext&)::token);
  }
  NULLC::TraceScope::TraceScope(&traceScope,ParseModule::token);
  begin = ctx->currentLexeme;
  (ctx->statistics).finishTime = 0;
  IVar3 = ParseImports(ctx);
  uVar1 = NULLCTime::clockMicro();
  (ctx->statistics).startTime = uVar1;
  (ctx->statistics).finishTime = 0;
  expressions = ParseExpressions(ctx);
  while (ctx->currentLexeme->type != lex_none) {
    anon_unknown.dwarf_147a9::Report(ctx,ctx->currentLexeme,"ERROR: unexpected symbol");
    if (ctx->currentLexeme->type != lex_none) {
      ctx->currentLexeme = ctx->currentLexeme + 1;
    }
    while (node = ParseExpression(ctx), node != (SynBase *)0x0) {
      IntrusiveList<SynBase>::push_back(&expressions,node);
    }
  }
  uVar1 = NULLCTime::clockMicro();
  CompilerStatistics::Finish(&ctx->statistics,"Parse",uVar1);
  if (expressions.head == (SynBase *)0x0) {
    anon_unknown.dwarf_147a9::Report(ctx,ctx->currentLexeme,"ERROR: module contains no code");
    iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x60);
    this = (SynModule *)CONCAT44(extraout_var_00,iVar2);
    local_68 = expressions.head;
    pSStack_60 = expressions.tail;
    SynBase::SynBase((SynBase *)this,0x43,begin,ctx->currentLexeme);
  }
  else {
    iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x60);
    this = (SynModule *)CONCAT44(extraout_var,iVar2);
    end = ParseContext::Previous(ctx);
    local_68 = expressions.head;
    pSStack_60 = expressions.tail;
    SynBase::SynBase((SynBase *)this,0x43,begin,end);
  }
  (this->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_0023ff08;
  this->imports = IVar3;
  (this->expressions).head = local_68;
  (this->expressions).tail = pSStack_60;
  NULLC::TraceScope::~TraceScope(&traceScope);
  return this;
}

Assistant:

SynModule* ParseModule(ParseContext &ctx)
{
	TRACE_SCOPE("parser", "ParseModule");

	Lexeme *start = ctx.currentLexeme;

	// Ignore nested import timing
	ctx.statistics.finishTime = 0;

	IntrusiveList<SynModuleImport> imports = ParseImports(ctx);

	ctx.statistics.Start(NULLCTime::clockMicro());

	IntrusiveList<SynBase> expressions = ParseExpressions(ctx);

	while(!ctx.Consume(lex_none))
	{
		Report(ctx, ctx.Current(), "ERROR: unexpected symbol");

		ctx.Skip();

		while(SynBase* expression = ParseExpression(ctx))
			expressions.push_back(expression);
	}

	ctx.statistics.Finish("Parse", NULLCTime::clockMicro());

	if(expressions.empty())
	{
		Report(ctx, ctx.Current(), "ERROR: module contains no code");

		return new (ctx.get<SynModule>()) SynModule(start, ctx.Current(), imports, expressions);
	}

	return new (ctx.get<SynModule>()) SynModule(start, ctx.Previous(), imports, expressions);
}